

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalToStackPass.cpp
# Opt level: O0

PreservedAnalyses * __thiscall
GlobalToStack::run(PreservedAnalyses *__return_storage_ptr__,GlobalToStack *this,Module *M,
                  ModuleAnalysisManager *AM)

{
  bool bVar1;
  SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
  *this_00;
  iterator ppVar2;
  pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_> *KV;
  iterator __end1_1;
  iterator __begin1_1;
  SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U> *__range1_1
  ;
  Function *local_248;
  Value *local_240;
  GlobalVariable *G;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  local_218;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  *local_208;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
  *__range1;
  SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U> Usage;
  ModuleAnalysisManager *AM_local;
  Module *M_local;
  GlobalToStack *this_local;
  PreservedAnalyses *PA;
  
  Usage.
  super_MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
  .Vector.
  super_SmallVectorStorage<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>
  .InlineElts._376_8_ = AM;
  llvm::SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U>::
  SmallMapVector((SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U>
                  *)&__range1);
  local_218 = llvm::Module::globals(M);
  local_208 = &local_218;
  __end1 = llvm::
           iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
           ::begin(local_208);
  G = (GlobalVariable *)
      llvm::
      iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>_>
      ::end(local_208);
  while( true ) {
    bVar1 = llvm::operator!=(&__end1,(ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                                      *)&G);
    if (!bVar1) break;
    local_240 = (Value *)llvm::
                         ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
                         ::operator*(&__end1);
    bVar1 = shouldInline(this,(GlobalVariable *)local_240);
    if (bVar1) {
      local_248 = getUsingFunction(local_240);
      this_00 = &llvm::
                 MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                 ::operator[]((MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                               *)&__range1,&local_248)->
                 super_SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
      ;
      __range1_1 = (SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U>
                    *)local_240;
      llvm::
      SetVector<llvm::GlobalVariable_*,_llvm::SmallVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseSet<llvm::GlobalVariable_*,_4U,_llvm::DenseMapInfo<llvm::GlobalVariable_*,_void>_>_>
      ::insert(this_00,(value_type *)&__range1_1);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::GlobalVariable,_false,_false,_void>,_false,_false>
    ::operator++(&__end1);
  }
  __end1_1 = llvm::
             MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
             ::begin((MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                      *)&__range1);
  ppVar2 = llvm::
           MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
           ::end((MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                  *)&__range1);
  for (; __end1_1 != ppVar2; __end1_1 = __end1_1 + 1) {
    inlineGlobals(this,__end1_1->first,&__end1_1->second);
  }
  bVar1 = llvm::
          MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
          ::empty((MapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_llvm::SmallDenseMap<llvm::Function_*,_unsigned_int,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseMapPair<llvm::Function_*,_unsigned_int>_>,_llvm::SmallVector<std::pair<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>_>,_4U>_>
                   *)&__range1);
  if (bVar1) {
    llvm::PreservedAnalyses::all();
  }
  else {
    llvm::PreservedAnalyses::PreservedAnalyses(__return_storage_ptr__);
    llvm::PreservedAnalyses::preserveSet<llvm::CFGAnalyses>(__return_storage_ptr__);
  }
  llvm::SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U>::
  ~SmallMapVector((SmallMapVector<llvm::Function_*,_llvm::SmallSetVector<llvm::GlobalVariable_*,_4U>,_4U>
                   *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

llvm::PreservedAnalyses GlobalToStack::run(Module &M,
                                           ModuleAnalysisManager &AM) {

  SmallMapVector<Function *, SmallSetVector<GlobalVariable *, 4>, 4> Usage;

  for (GlobalVariable &G : M.globals())
    if (shouldInline(G))
      Usage[getUsingFunction(G)].insert(&G);

  for (auto &KV : Usage)
    inlineGlobals(KV.first, KV.second);

  if (Usage.empty()) {
    return llvm::PreservedAnalyses::all();
  }

  llvm::PreservedAnalyses PA;
  PA.preserveSet<CFGAnalyses>();
  return PA;
}